

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.cc
# Opt level: O1

void __thiscall rcg::Stream::stopStreaming(Stream *this)

{
  recursive_mutex *__mutex;
  int iVar1;
  GC_ERROR GVar2;
  long *plVar3;
  long lVar4;
  ICommand *pIVar5;
  undefined8 uVar6;
  undefined8 *puVar7;
  ulong uVar8;
  shared_ptr<GenApi_3_4::CNodeMapRef> nmap;
  CCommandPtr stop;
  BUFFER_HANDLE p;
  undefined1 local_90 [32];
  element_type *local_70 [10];
  
  __mutex = &this->mtx;
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar1 == 0) {
    if (this->bn != 0) {
      Buffer::setHandle(&this->buffer,(void *)0x0);
      Device::getRemoteNodeMap
                ((Device *)local_90,
                 (char *)(this->parent).super___shared_ptr<rcg::Device,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr);
      uVar6 = local_90._0_8_;
      GenICam_3_4::gcstring::gcstring((gcstring *)local_70,"AcquisitionStop");
      plVar3 = (long *)(*(code *)(((((enable_shared_from_this<rcg::Device> *)uVar6)->_M_weak_this).
                                   super___weak_ptr<rcg::Device,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                                 ->id)._M_string_length)(uVar6,local_70);
      if (plVar3 == (long *)0x0) {
        lVar4 = 0;
      }
      else {
        lVar4 = (long)plVar3 + *(long *)(*plVar3 + -0x28);
      }
      local_90._16_8_ = &PTR__CPointer_0012c718;
      if (lVar4 == 0) {
        local_90._24_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      }
      else {
        local_90._24_8_ =
             __dynamic_cast(lVar4,&GenApi_3_4::IBase::typeinfo,&GenApi_3_4::ICommand::typeinfo,
                            0xffffffffffffffff);
      }
      GenICam_3_4::gcstring::~gcstring((gcstring *)local_70);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_90._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_90._8_8_);
      }
      pIVar5 = GenApi_3_4::CPointer<GenApi_3_4::ICommand,_GenApi_3_4::IBase>::operator->
                         ((CPointer<GenApi_3_4::ICommand,_GenApi_3_4::IBase> *)(local_90 + 0x10));
      (**(code **)(*(long *)pIVar5 + 0x38))(pIVar5,1);
      (*((this->gentl).super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr)->DSStopAcquisition)(this->stream,0);
      (*((this->gentl).super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr)->GCUnregisterEvent)(this->stream,1);
      (*((this->gentl).super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr)->DSFlushQueue)(this->stream,4);
      if (this->bn != 0) {
        uVar8 = 0;
        do {
          local_70[0] = (element_type *)0x0;
          GVar2 = (*((this->gentl).
                     super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                    ->DSGetBufferID)(this->stream,0,local_70);
          if (GVar2 == 0) {
            (*((this->gentl).super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr)->DSRevokeBuffer)(this->stream,local_70[0],(void **)0x0,(void **)0x0);
          }
          uVar8 = uVar8 + 1;
        } while (uVar8 < this->bn);
      }
      this->event = (void *)0x0;
      this->bn = 0;
      Device::getRemoteNodeMap
                ((Device *)local_90,
                 (char *)(this->parent).super___shared_ptr<rcg::Device,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr);
      GenICam_3_4::gcstring::gcstring((gcstring *)local_70,"TLParamsLocked");
      lVar4 = (*(code *)(((((enable_shared_from_this<rcg::Device> *)local_90._0_8_)->_M_weak_this).
                          super___weak_ptr<rcg::Device,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->id).
                        _M_string_length)(local_90._0_8_,local_70);
      if (lVar4 == 0) {
        plVar3 = (long *)0x0;
      }
      else {
        plVar3 = (long *)__dynamic_cast(lVar4,&GenApi_3_4::INode::typeinfo,
                                        &GenApi_3_4::IInteger::typeinfo,0xfffffffffffffffe);
      }
      GenICam_3_4::gcstring::~gcstring((gcstring *)local_70);
      if (plVar3 == (long *)0x0) {
        puVar7 = (undefined8 *)0x0;
      }
      else {
        puVar7 = (undefined8 *)(*(long *)(*plVar3 + -0x28) + (long)plVar3);
      }
      if (puVar7 != (undefined8 *)0x0) {
        iVar1 = (**(code **)*puVar7)();
        if ((iVar1 == 4) || (iVar1 == 2)) {
          (**(code **)(*plVar3 + 0x38))(plVar3,0,1);
        }
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_90._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_90._8_8_);
      }
    }
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    return;
  }
  uVar6 = std::__throw_system_error(iVar1);
  GenICam_3_4::gcstring::~gcstring((gcstring *)local_70);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_90._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_90._8_8_);
  }
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  _Unwind_Resume(uVar6);
}

Assistant:

void Stream::stopStreaming()
{
  std::lock_guard<std::recursive_mutex> lock(mtx);

  if (bn > 0)
  {
    buffer.setHandle(0);

    // do not throw exceptions as this method is also called in destructor

    GenApi::CCommandPtr stop=parent->getRemoteNodeMap()->_GetNode("AcquisitionStop");
    stop->Execute();

    gentl->DSStopAcquisition(stream, GenTL::ACQ_STOP_FLAGS_DEFAULT);
    gentl->GCUnregisterEvent(stream, GenTL::EVENT_NEW_BUFFER);
    gentl->DSFlushQueue(stream, GenTL::ACQ_QUEUE_ALL_DISCARD);

    // free all buffers

    for (size_t i=0; i<bn; i++)
    {
      GenTL::BUFFER_HANDLE p=0;
      if (gentl->DSGetBufferID(stream, 0, &p) == GenTL::GC_ERR_SUCCESS)
      {
        gentl->DSRevokeBuffer(stream, p, 0, 0);
      }
    }

    event=0;
    bn=0;

    // unlock parameters

    std::shared_ptr<GenApi::CNodeMapRef> nmap=parent->getRemoteNodeMap();
    GenApi::IInteger *pi=dynamic_cast<GenApi::IInteger *>(nmap->_GetNode("TLParamsLocked"));

    if (GenApi::IsWritable(pi))
    {
      pi->SetValue(0);
    }
  }
}